

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSW.cpp
# Opt level: O2

void __thiscall Storage::Tape::CSW::CSW(CSW *this,string *file_name)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long lVar1;
  bool bVar2;
  uint8_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  stat *psVar7;
  undefined7 extraout_var;
  long lVar8;
  undefined4 *puVar9;
  uint uVar10;
  void *__buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  uLongf output_length;
  FileHolder file;
  ulong __nbytes;
  
  (this->super_Tape).pulse_.length.length = 0;
  (this->super_Tape).pulse_.length.clock_rate = 1;
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_0058f390;
  *(undefined8 *)&this->field_0x20 = 0x100000000;
  this_00 = &this->source_data_;
  (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->source_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->source_data_pointer_ = 0;
  FileHolder::FileHolder(&file,file_name,ReadWrite);
  psVar7 = FileHolder::stats(&file);
  if (0x1f < psVar7->st_size) {
    bVar2 = FileHolder::check_signature(&file,"Compressed Square Wave",0);
    if (bVar2) {
      uVar3 = FileHolder::get8(&file);
      if (uVar3 == '\x1a') {
        uVar3 = FileHolder::get8(&file);
        bVar4 = FileHolder::get8(&file);
        uVar10 = (int)CONCAT71(extraout_var,uVar3) - 3;
        __nbytes = (ulong)uVar10;
        if (((byte)uVar10 < 0xfe) || (1 < bVar4)) {
          puVar9 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar9 = 0;
          __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
        }
        if (uVar3 == '\x01') {
          uVar5 = FileHolder::get16le(&file);
          *(uint *)&this->field_0x24 = (uint)uVar5;
          uVar3 = FileHolder::get8(&file);
          if (uVar3 != '\x01') {
LAB_003ebcaa:
            puVar9 = (undefined4 *)__cxa_allocate_exception(4);
            *puVar9 = 0;
            __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
          }
          this->compression_type_ = RLE;
          bVar4 = FileHolder::get8(&file);
          *(uint *)&(this->super_Tape).field_0x1c = (uint)(~bVar4 & 1);
          uVar6 = 0;
          FileHolder::seek(&file,0x20,0);
        }
        else {
          uVar6 = FileHolder::get32le(&file);
          *(uint32_t *)&this->field_0x24 = uVar6;
          uVar6 = FileHolder::get32le(&file);
          uVar3 = FileHolder::get8(&file);
          __nbytes = 0;
          if (uVar3 != '\x01') {
            if (uVar3 != '\x02') goto LAB_003ebcaa;
            __nbytes = 1;
          }
          this->compression_type_ = (CompressionType)__nbytes;
          bVar4 = FileHolder::get8(&file);
          *(uint *)&(this->super_Tape).field_0x1c = (uint)(~bVar4 & 1);
          bVar4 = FileHolder::get8(&file);
          psVar7 = FileHolder::stats(&file);
          if (psVar7->st_size < (long)((ulong)bVar4 + 0x34)) {
            puVar9 = (undefined4 *)__cxa_allocate_exception(4);
            *puVar9 = 0;
            __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
          }
          FileHolder::seek(&file,(ulong)bVar4 + 0x34,0);
        }
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar7 = FileHolder::stats(&file);
        lVar1 = psVar7->st_size;
        lVar8 = FileHolder::tell(&file);
        __buf = (void *)(lVar1 - lVar8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&file_data,(size_type)__buf);
        FileHolder::read(&file,(int)file_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,__buf,__nbytes);
        if (this->compression_type_ == ZRLE) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (this_00,(ulong)uVar6 * 5);
          output_length = (uLongf)(uVar6 * 5);
          uncompress((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start,&output_length,
                     file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)file_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)file_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,output_length);
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (this_00,&file_data);
        }
        *(uint *)&(this->super_Tape).field_0x1c =
             (uint)(*(int *)&(this->super_Tape).field_0x1c == 0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        FileHolder::~FileHolder(&file);
        return;
      }
    }
  }
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
}

Assistant:

CSW::CSW(const std::string &file_name) :
	source_data_pointer_(0) {
	Storage::FileHolder file(file_name);
	if(file.stats().st_size < 0x20) throw ErrorNotCSW;

	// Check signature.
	if(!file.check_signature("Compressed Square Wave")) {
		throw ErrorNotCSW;
	}

	// Check terminating byte.
	if(file.get8() != 0x1a) throw ErrorNotCSW;

	// Get version file number.
	uint8_t major_version = file.get8();
	uint8_t minor_version = file.get8();

	// Reject if this is an unknown version.
	if(major_version > 2 || !major_version || minor_version > 1) throw ErrorNotCSW;

	// The header now diverges based on version.
	uint32_t number_of_waves = 0;
	if(major_version == 1) {
		pulse_.length.clock_rate = file.get16le();

		if(file.get8() != 1) throw ErrorNotCSW;
		compression_type_ = CompressionType::RLE;

		pulse_.type = (file.get8() & 1) ? Pulse::High : Pulse::Low;

		file.seek(0x20, SEEK_SET);
	} else {
		pulse_.length.clock_rate = file.get32le();
		number_of_waves = file.get32le();
		switch(file.get8()) {
			case 1: compression_type_ = CompressionType::RLE;	break;
			case 2: compression_type_ = CompressionType::ZRLE;	break;
			default: throw ErrorNotCSW;
		}

		pulse_.type = (file.get8() & 1) ? Pulse::High : Pulse::Low;
		uint8_t extension_length = file.get8();

		if(file.stats().st_size < 0x34 + extension_length) throw ErrorNotCSW;
		file.seek(0x34 + extension_length, SEEK_SET);
	}

	// Grab all data remaining in the file.
	std::vector<uint8_t> file_data;
	std::size_t remaining_data = size_t(file.stats().st_size) - size_t(file.tell());
	file_data.resize(remaining_data);
	file.read(file_data.data(), remaining_data);

	if(compression_type_ == CompressionType::ZRLE) {
		// The only clue given by CSW as to the output size in bytes is that there will be
		// number_of_waves waves. Waves are usually one byte, but may be five. So this code
		// is pessimistic.
		source_data_.resize(size_t(number_of_waves) * 5);

		// uncompress will tell how many compressed bytes there actually were, so use its
		// modification of output_length to throw away all the memory that isn't actually
		// needed.
		uLongf output_length = uLongf(number_of_waves * 5);
		uncompress(source_data_.data(), &output_length, file_data.data(), file_data.size());
		source_data_.resize(std::size_t(output_length));
	} else {
		source_data_ = std::move(file_data);
	}

	invert_pulse();
}